

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture.c
# Opt level: O2

ktx_error_code_e ktxTexture_IterateLevelFaces(ktxTexture *This,PFNKTXITERCB iterCb,void *userdata)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  ktx_error_code_e kVar4;
  ktx_size_t kVar5;
  byte bVar6;
  ktx_uint32_t kVar7;
  ktx_error_code_e kVar8;
  uint uVar9;
  ktx_uint32_t kVar10;
  ktx_size_t offset;
  
  if (iterCb == (PFNKTXITERCB)0x0 || This == (ktxTexture *)0x0) {
    kVar8 = KTX_INVALID_VALUE;
  }
  else {
    kVar8 = KTX_SUCCESS;
    for (uVar9 = 0; uVar9 < This->numLevels; uVar9 = uVar9 + 1) {
      bVar6 = (byte)uVar9;
      uVar1 = This->baseWidth >> (bVar6 & 0x1f);
      uVar2 = This->baseHeight >> (bVar6 & 0x1f);
      uVar3 = This->baseDepth >> (bVar6 & 0x1f);
      kVar5 = (*(This->_protected->_vtbl).calcFaceLodSize)(This,uVar9);
      kVar10 = 1;
      if ((This->isCubemap == true) && (This->isArray == false)) {
        kVar10 = This->numFaces;
      }
      kVar7 = 0;
      do {
        kVar4 = kVar8;
        if (kVar10 == kVar7) break;
        kVar8 = KTX_SUCCESS;
        (*This->vtbl->GetImageOffset)(This,uVar9,0,kVar7,&offset);
        kVar4 = (*iterCb)(uVar9,kVar7,uVar1 + (uVar1 == 0),uVar2 + (uVar2 == 0),uVar3 + (uVar3 == 0)
                          ,(ktx_uint64_t)kVar5,This->pData + offset,userdata);
        kVar7 = kVar7 + 1;
      } while (kVar4 == KTX_SUCCESS);
      kVar8 = kVar4;
    }
  }
  return kVar8;
}

Assistant:

KTX_error_code
ktxTexture_IterateLevelFaces(ktxTexture* This, PFNKTXITERCB iterCb,
                             void* userdata)
{
    ktx_uint32_t    miplevel;
    KTX_error_code  result = KTX_SUCCESS;

    if (This == NULL)
        return KTX_INVALID_VALUE;

    if (iterCb == NULL)
        return KTX_INVALID_VALUE;

    for (miplevel = 0; miplevel < This->numLevels; ++miplevel)
    {
        ktx_uint32_t faceLodSize;
        ktx_uint32_t face;
        ktx_uint32_t innerIterations;
        GLsizei      width, height, depth;

        /* Array textures have the same number of layers at each mip level. */
        width = MAX(1, This->baseWidth  >> miplevel);
        height = MAX(1, This->baseHeight >> miplevel);
        depth = MAX(1, This->baseDepth  >> miplevel);

        faceLodSize = (ktx_uint32_t)ktxTexture_calcFaceLodSize(
                                                    This, miplevel);

        /* All array layers are passed in a group because that is how
         * GL & Vulkan need them. Hence no
         *    for (layer = 0; layer < This->numLayers)
         */
        if (This->isCubemap && !This->isArray)
            innerIterations = This->numFaces;
        else
            innerIterations = 1;
        for (face = 0; face < innerIterations; ++face)
        {
            /* And all z_slices are also passed as a group hence no
             *    for (slice = 0; slice < This->depth)
             */
            ktx_size_t offset;

            ktxTexture_GetImageOffset(This, miplevel, 0, face, &offset);
            result = iterCb(miplevel, face,
                            width, height, depth,
                            faceLodSize, This->pData + offset, userdata);

            if (result != KTX_SUCCESS)
                break;
        }
    }

    return result;
}